

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

FunctionBody * __thiscall
Js::DeferDeserializeFunctionInfo::Deserialize(DeferDeserializeFunctionInfo *this)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionBody *body;
  JavascriptMethod originalEntryPoint;
  
  if ((DeferDeserializeFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x8b0,"(this->GetFunctionInfo()->GetFunctionProxy() == this)",
                                "this->GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  body = ByteCodeSerializer::DeserializeFunction((this->super_FunctionProxy).m_scriptContext,this);
  if ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  TVar1 = ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionId;
  if ((this->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c7,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  if ((DeferDeserializeFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c8,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  ((this->super_FunctionProxy).functionInfo.ptr)->functionId = TVar1;
  if ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4d5,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  if ((FunctionBody *)
      (((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != body) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4d6,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  originalEntryPoint =
       FunctionInfo::GetOriginalEntryPoint
                 ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr);
  if ((this->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  if ((DeferDeserializeFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0076a4bf;
    *puVar4 = 0;
  }
  FunctionInfo::SetOriginalEntryPoint
            ((this->super_FunctionProxy).functionInfo.ptr,originalEntryPoint);
  FunctionProxy::Copy(&this->super_FunctionProxy,(FunctionProxy *)body);
  FunctionProxy::UpdateFunctionBodyImpl(&this->super_FunctionProxy,body);
  bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)body);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar3) {
LAB_0076a4bf:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return body;
}

Assistant:

FunctionBody* DeferDeserializeFunctionInfo::Deserialize()
    {
        Assert(this->GetFunctionInfo()->GetFunctionProxy() == this);

        FunctionBody * body = ByteCodeSerializer::DeserializeFunction(this->m_scriptContext, this);
        this->SetLocalFunctionId(body->GetLocalFunctionId());
        this->SetOriginalEntryPoint(body->GetOriginalEntryPoint());
        this->Copy(body);
        this->UpdateFunctionBodyImpl(body);

        Assert(body->GetFunctionBody() == body);
        return body;
    }